

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int rtreeUpdate(sqlite3_vtab *pVtab,int nData,sqlite3_value **aData,sqlite_int64 *pRowid)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Mem *pMVar4;
  Vdbe *pVVar5;
  sqlite3_mutex *psVar6;
  sqlite3_stmt *pStmt;
  RtreeNode *pNode;
  int iVar7;
  int iVar8;
  ulong uVar9;
  i64 iVar10;
  i64 iVar11;
  _func_int_sqlite3_vtab_cursor_ptr *iValue;
  _func_int_sqlite3_vtab_cursor_ptr *p_Var12;
  Vdbe *p;
  ulong uVar13;
  long lVar14;
  bool bVar15;
  double dVar16;
  float fVar17;
  float fVar18;
  RtreeNode *pLeaf;
  RtreeCell cell;
  RtreeNode *local_70;
  sqlite_int64 *local_68;
  RtreeCell local_60;
  
  if (*(int *)&pVtab[3].field_0xc != 0) {
    return 0x206;
  }
  *(int *)&pVtab[2].zErrMsg = *(int *)&pVtab[2].zErrMsg + 1;
  local_60.iRowid = 0;
  bVar15 = false;
  iVar8 = 0;
  if (1 < nData) {
    uVar9 = (ulong)(byte)pVtab[1].field_0xd;
    if ((int)(nData - 4U) < (int)(uint)(byte)pVtab[1].field_0xd) {
      uVar9 = (ulong)(nData - 4U);
    }
    local_68 = pRowid;
    if (pVtab[1].field_0xe == '\0') {
      if (0 < (int)uVar9) {
        uVar13 = 0;
        do {
          dVar16 = sqlite3VdbeRealValue(aData[uVar13 + 3]);
          fVar18 = (float)dVar16;
          if (dVar16 < (double)fVar18) {
            fVar18 = (float)(dVar16 * *(double *)
                                       ("ove_diacritics=1ove_diacritics=0ove_diacritics=2" +
                                       (ulong)(dVar16 < 0.0) * 8 + 0x30));
          }
          local_60.aCoord[uVar13].f = fVar18;
          dVar16 = sqlite3VdbeRealValue(aData[uVar13 + 4]);
          fVar17 = (float)dVar16;
          if ((double)fVar17 < dVar16) {
            fVar17 = (float)(dVar16 * *(double *)(&DAT_001df3b0 + (ulong)(dVar16 < 0.0) * 8));
          }
          local_60.aCoord[uVar13 + 1].f = fVar17;
          if (fVar17 < fVar18) goto LAB_001ca1d1;
          uVar13 = uVar13 + 2;
        } while (uVar13 < uVar9);
      }
    }
    else if (0 < (int)uVar9) {
      uVar13 = 0;
      do {
        iVar10 = sqlite3VdbeIntValue(aData[uVar13 + 3]);
        local_60.aCoord[uVar13].i = (int)iVar10;
        iVar11 = sqlite3VdbeIntValue(aData[uVar13 + 4]);
        local_60.aCoord[uVar13 + 1].i = (int)iVar11;
        if ((int)iVar11 < (int)iVar10) goto LAB_001ca1d1;
        uVar13 = uVar13 + 2;
      } while (uVar13 < uVar9);
    }
    pMVar4 = aData[2];
    iVar7 = 0;
    uVar1._0_2_ = pMVar4->flags;
    uVar1._2_1_ = pMVar4->enc;
    uVar1._3_1_ = pMVar4->eSubtype;
    if ((0xaaaaaaaaU >> (uVar1 & 0x1f) & 1) == 0) {
      iValue = (_func_int_sqlite3_vtab_cursor_ptr *)sqlite3VdbeIntValue(pMVar4);
      pMVar4 = *aData;
      uVar2._0_2_ = pMVar4->flags;
      uVar2._2_1_ = pMVar4->enc;
      uVar2._3_1_ = pMVar4->eSubtype;
      local_60.iRowid = (i64)iValue;
      if ((0xaaaaaaaaU >> (uVar2 & 0x1f) & 1) == 0) {
        p_Var12 = (_func_int_sqlite3_vtab_cursor_ptr *)sqlite3VdbeIntValue(pMVar4);
        bVar15 = true;
        iVar8 = 0;
        if (p_Var12 == iValue) goto LAB_001ca216;
      }
      sqlite3_bind_int64((sqlite3_stmt *)pVtab[5].zErrMsg,1,(sqlite_int64)iValue);
      iVar7 = sqlite3_step((sqlite3_stmt *)pVtab[5].zErrMsg);
      iVar8 = sqlite3_reset((sqlite3_stmt *)pVtab[5].zErrMsg);
      bVar15 = true;
      if (iVar7 == 100) {
        bVar15 = *(char *)((long)&(pVtab[1].pModule)->xRowid + 6) != '\x05';
        if (bVar15) {
          iVar8 = rtreeConstraintError((Rtree *)pVtab,0);
          iVar7 = 5;
        }
        else {
          iVar8 = rtreeDeleteRowid((Rtree *)pVtab,(sqlite3_int64)iValue);
          iVar7 = 0;
        }
        bVar15 = !bVar15;
      }
      else {
        iVar7 = 0;
      }
      if (bVar15) {
        iVar7 = 0;
      }
    }
    else {
      bVar15 = false;
      iVar8 = 0;
    }
    goto LAB_001ca216;
  }
LAB_001ca22e:
  pMVar4 = *aData;
  uVar3._0_2_ = pMVar4->flags;
  uVar3._2_1_ = pMVar4->enc;
  uVar3._3_1_ = pMVar4->eSubtype;
  if ((0xaaaaaaaaU >> (uVar3 & 0x1f) & 1) == 0) {
    iVar10 = sqlite3VdbeIntValue(pMVar4);
    iVar8 = rtreeDeleteRowid((Rtree *)pVtab,iVar10);
  }
  if ((1 < nData) && (iVar8 == 0)) {
    local_70 = (RtreeNode *)0x0;
    iVar8 = 0;
    if (!bVar15) {
      pVVar5 = (Vdbe *)pVtab[6].pModule;
      iVar8 = vdbeUnbind(pVVar5,1);
      if ((iVar8 == 0) && (psVar6 = pVVar5->db->mutex, psVar6 != (sqlite3_mutex *)0x0)) {
        (*sqlite3Config.mutex.xMutexLeave)(psVar6);
      }
      pVVar5 = (Vdbe *)pVtab[6].pModule;
      iVar8 = vdbeUnbind(pVVar5,2);
      if ((iVar8 == 0) && (psVar6 = pVVar5->db->mutex, psVar6 != (sqlite3_mutex *)0x0)) {
        (*sqlite3Config.mutex.xMutexLeave)(psVar6);
      }
      sqlite3_step((sqlite3_stmt *)pVtab[6].pModule);
      iVar8 = sqlite3_reset((sqlite3_stmt *)pVtab[6].pModule);
      local_60.iRowid = (i64)(pVtab[1].pModule)->xClose;
    }
    *pRowid = local_60.iRowid;
    if (iVar8 == 0) {
      iVar8 = ChooseLeaf((Rtree *)pVtab,&local_60,0,&local_70);
    }
    pNode = local_70;
    if (iVar8 == 0) {
      pVtab[4].nRef = -1;
      iVar7 = rtreeInsertCell((Rtree *)pVtab,local_70,&local_60,0);
      iVar8 = nodeRelease((Rtree *)pVtab,pNode);
      if (iVar7 != 0) {
        iVar8 = iVar7;
      }
    }
    if (iVar8 == 0) {
      if (*(char *)((long)&pVtab[1].zErrMsg + 1) == '\0') {
        iVar8 = 0;
      }
      else {
        pStmt = (sqlite3_stmt *)pVtab[7].zErrMsg;
        sqlite3_bind_int64(pStmt,1,*pRowid);
        if (*(char *)((long)&pVtab[1].zErrMsg + 1) != '\0') {
          lVar14 = 0;
          do {
            sqlite3_bind_value(pStmt,(int)lVar14 + 2,
                               aData[(ulong)(byte)pVtab[1].field_0xd + lVar14 + 3]);
            lVar14 = lVar14 + 1;
          } while ((uint)lVar14 < (uint)*(byte *)((long)&pVtab[1].zErrMsg + 1));
        }
        sqlite3_step(pStmt);
        iVar8 = sqlite3_reset(pStmt);
      }
    }
  }
LAB_001ca3ab:
  rtreeRelease((Rtree *)pVtab);
  return iVar8;
LAB_001ca1d1:
  iVar8 = rtreeConstraintError((Rtree *)pVtab,(int)uVar13 + 1);
  bVar15 = false;
  iVar7 = 5;
LAB_001ca216:
  if (iVar7 == 5) goto LAB_001ca3ab;
  pRowid = local_68;
  if (iVar7 != 0) {
    return iVar8;
  }
  goto LAB_001ca22e;
}

Assistant:

static int rtreeUpdate(
  sqlite3_vtab *pVtab, 
  int nData, 
  sqlite3_value **aData, 
  sqlite_int64 *pRowid
){
  Rtree *pRtree = (Rtree *)pVtab;
  int rc = SQLITE_OK;
  RtreeCell cell;                 /* New cell to insert if nData>1 */
  int bHaveRowid = 0;             /* Set to 1 after new rowid is determined */

  if( pRtree->nNodeRef ){
    /* Unable to write to the btree while another cursor is reading from it,
    ** since the write might do a rebalance which would disrupt the read
    ** cursor. */
    return SQLITE_LOCKED_VTAB;
  }
  rtreeReference(pRtree);
  assert(nData>=1);

  cell.iRowid = 0;  /* Used only to suppress a compiler warning */

  /* Constraint handling. A write operation on an r-tree table may return
  ** SQLITE_CONSTRAINT for two reasons:
  **
  **   1. A duplicate rowid value, or
  **   2. The supplied data violates the "x2>=x1" constraint.
  **
  ** In the first case, if the conflict-handling mode is REPLACE, then
  ** the conflicting row can be removed before proceeding. In the second
  ** case, SQLITE_CONSTRAINT must be returned regardless of the
  ** conflict-handling mode specified by the user.
  */
  if( nData>1 ){
    int ii;
    int nn = nData - 4;

    if( nn > pRtree->nDim2 ) nn = pRtree->nDim2;
    /* Populate the cell.aCoord[] array. The first coordinate is aData[3].
    **
    ** NB: nData can only be less than nDim*2+3 if the rtree is mis-declared
    ** with "column" that are interpreted as table constraints.
    ** Example:  CREATE VIRTUAL TABLE bad USING rtree(x,y,CHECK(y>5));
    ** This problem was discovered after years of use, so we silently ignore
    ** these kinds of misdeclared tables to avoid breaking any legacy.
    */

#ifndef SQLITE_RTREE_INT_ONLY
    if( pRtree->eCoordType==RTREE_COORD_REAL32 ){
      for(ii=0; ii<nn; ii+=2){
        cell.aCoord[ii].f = rtreeValueDown(aData[ii+3]);
        cell.aCoord[ii+1].f = rtreeValueUp(aData[ii+4]);
        if( cell.aCoord[ii].f>cell.aCoord[ii+1].f ){
          rc = rtreeConstraintError(pRtree, ii+1);
          goto constraint;
        }
      }
    }else
#endif
    {
      for(ii=0; ii<nn; ii+=2){
        cell.aCoord[ii].i = sqlite3_value_int(aData[ii+3]);
        cell.aCoord[ii+1].i = sqlite3_value_int(aData[ii+4]);
        if( cell.aCoord[ii].i>cell.aCoord[ii+1].i ){
          rc = rtreeConstraintError(pRtree, ii+1);
          goto constraint;
        }
      }
    }

    /* If a rowid value was supplied, check if it is already present in 
    ** the table. If so, the constraint has failed. */
    if( sqlite3_value_type(aData[2])!=SQLITE_NULL ){
      cell.iRowid = sqlite3_value_int64(aData[2]);
      if( sqlite3_value_type(aData[0])==SQLITE_NULL
       || sqlite3_value_int64(aData[0])!=cell.iRowid
      ){
        int steprc;
        sqlite3_bind_int64(pRtree->pReadRowid, 1, cell.iRowid);
        steprc = sqlite3_step(pRtree->pReadRowid);
        rc = sqlite3_reset(pRtree->pReadRowid);
        if( SQLITE_ROW==steprc ){
          if( sqlite3_vtab_on_conflict(pRtree->db)==SQLITE_REPLACE ){
            rc = rtreeDeleteRowid(pRtree, cell.iRowid);
          }else{
            rc = rtreeConstraintError(pRtree, 0);
            goto constraint;
          }
        }
      }
      bHaveRowid = 1;
    }
  }

  /* If aData[0] is not an SQL NULL value, it is the rowid of a
  ** record to delete from the r-tree table. The following block does
  ** just that.
  */
  if( sqlite3_value_type(aData[0])!=SQLITE_NULL ){
    rc = rtreeDeleteRowid(pRtree, sqlite3_value_int64(aData[0]));
  }

  /* If the aData[] array contains more than one element, elements
  ** (aData[2]..aData[argc-1]) contain a new record to insert into
  ** the r-tree structure.
  */
  if( rc==SQLITE_OK && nData>1 ){
    /* Insert the new record into the r-tree */
    RtreeNode *pLeaf = 0;

    /* Figure out the rowid of the new row. */
    if( bHaveRowid==0 ){
      rc = rtreeNewRowid(pRtree, &cell.iRowid);
    }
    *pRowid = cell.iRowid;

    if( rc==SQLITE_OK ){
      rc = ChooseLeaf(pRtree, &cell, 0, &pLeaf);
    }
    if( rc==SQLITE_OK ){
      int rc2;
      pRtree->iReinsertHeight = -1;
      rc = rtreeInsertCell(pRtree, pLeaf, &cell, 0);
      rc2 = nodeRelease(pRtree, pLeaf);
      if( rc==SQLITE_OK ){
        rc = rc2;
      }
    }
    if( rc==SQLITE_OK && pRtree->nAux ){
      sqlite3_stmt *pUp = pRtree->pWriteAux;
      int jj;
      sqlite3_bind_int64(pUp, 1, *pRowid);
      for(jj=0; jj<pRtree->nAux; jj++){
        sqlite3_bind_value(pUp, jj+2, aData[pRtree->nDim2+3+jj]);
      }
      sqlite3_step(pUp);
      rc = sqlite3_reset(pUp);
    }
  }

constraint:
  rtreeRelease(pRtree);
  return rc;
}